

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O2

TabularDataFile * __thiscall asl::TabularDataFile::operator<<(TabularDataFile *this,Var *x)

{
  Array<asl::Var> *this_00;
  Var *this_01;
  Type TVar1;
  bool bVar2;
  int iVar3;
  Var *pVVar4;
  anon_union_16_2_78e7fdac_for_String_2 *x_00;
  long lVar5;
  long lVar6;
  float fVar7;
  String row;
  String value;
  String local_60;
  String local_48;
  
  bVar2 = Var::operator==(x,"\n");
  if ((!bVar2) || (bVar2 = true, (int)(this->_row)._a[-1]._type < 1)) {
    if (x->_type == ARRAY) {
      Var::array((Var *)&row);
      Array<asl::Var>::operator=(&this->_row,(Array<asl::Var> *)&row);
      Array<asl::Var>::~Array((Array<asl::Var> *)&row);
    }
    else {
      Array<asl::Var>::operator<<(&this->_row,x);
    }
    bVar2 = false;
  }
  if ((bVar2) || ((this->_row)._a[-1]._type == *(Type *)&(this->_columnNames)._a[-1].field_2)) {
    row._size = 0;
    row._len = 0;
    row.field_2._space[0] = '\0';
    if (this->_dataStarted == false) {
      String::operator+=(&row,'\n');
      this->_dataStarted = true;
    }
    this_00 = &this->_row;
    lVar6 = 0;
    for (lVar5 = 0; pVVar4 = this_00->_a, lVar5 < (int)pVVar4[-1]._type; lVar5 = lVar5 + 1) {
      if (lVar6 != 0) {
        String::operator+=(&row,this->_separator);
        pVVar4 = this_00->_a;
      }
      this_01 = (Var *)((long)&pVVar4->_type + lVar6);
      if (*(int *)((long)&pVVar4->_type + lVar6) == 0) {
        value.field_2._space[0] = '\0';
        value._size = 0;
        value._len = 0;
      }
      else {
        Var::toString(&value,this_01);
      }
      if (((FLOAT < this_01->_type) || ((0x54U >> (this_01->_type & 0x1f) & 1) == 0)) ||
         (fVar7 = Var::operator_cast_to_float(this_01), !NAN(fVar7))) {
        TVar1 = this_01->_type;
        if (this->_decimal == '.') {
          if ((TVar1 == STRING) || (TVar1 == SSTRING)) {
LAB_0013c8a3:
            bVar2 = String::contains(&value,this->_quote);
            if ((bVar2) || (bVar2 = String::contains(&value,this->_separator), bVar2)) {
              String::operator+=(&row,this->_quote);
              String::String(&local_60,this->_quote);
              String::replace(&local_48,&value,&local_60,&this->_equote);
              String::operator+=(&row,&local_48);
              String::operator+=(&row,this->_quote);
              String::~String(&local_48);
              String::~String(&local_60);
              goto LAB_0013c948;
            }
          }
        }
        else if (TVar1 < ARRAY) {
          if ((0x54U >> (TVar1 & 0x1f) & 1) == 0) {
            if ((0x120U >> (TVar1 & 0x1f) & 1) != 0) goto LAB_0013c8a3;
          }
          else {
            String::replaceme(&value,'.',this->_decimal);
          }
        }
        String::operator+=(&row,&value);
      }
LAB_0013c948:
      String::~String(&value);
      lVar6 = lVar6 + 0x10;
    }
    String::operator+=(&row,'\n');
    if (row._size == 0) {
      x_00 = &row.field_2;
    }
    else {
      x_00 = (anon_union_16_2_78e7fdac_for_String_2 *)
             CONCAT71(row.field_2._1_7_,row.field_2._space[0]);
    }
    TextFile::operator<<(&this->_file,x_00->_space);
    iVar3 = this->_rowIndex + 1;
    this->_rowIndex = iVar3;
    if (iVar3 == this->_flushEvery) {
      File::flush((File *)this);
      this->_rowIndex = 0;
    }
    Array<asl::Var>::clear(this_00);
    String::~String(&row);
  }
  return this;
}

Assistant:

TabularDataFile& TabularDataFile::operator<<(const Var& x)
{
	bool rowFull = false;
	if (x == "\n" && _row.length() > 0)
		rowFull = true;
	else if (x.is(Var::ARRAY))
		_row = x.array();
	else
		_row << x;
	if (_row.length() == _columnNames.length() || rowFull)
	{
		String row;
		if(!_dataStarted)
		{
			row << '\n';
			_dataStarted = true;
		}
		for(int i=0; i<_row.length(); i++)
		{
			if(i>0)
				row << _separator;
			Var& item = _row[i];
			String value = item.ok() ? item.toString() : String();

			if (item.is(Var::NUMBER))
			{
				float y = item; // print nans empty
				if (y != y)
					continue;
			}
			if (_decimal != '.' && item.is(Var::NUMBER))
			{
				value.replaceme('.', _decimal);
				row << value;
			}
			else if (item.is(Var::STRING))
			{
				if (value.contains(_quote) || value.contains(_separator))
					row << _quote << value.replace(_quote, _equote) << _quote;
				else
					row << value;
			}
			else
				row << value;
		}
		row << '\n';
		_file << *row;
		if(++_rowIndex == _flushEvery)
		{
			_file.flush();
			_rowIndex = 0;
		}
		_row.clear();
	}
	return *this;
}